

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O3

int Sfm_DecPeformDec3(Sfm_Dec_t *p,Abc_Obj_t *pObj)

{
  Vec_Int_t *vMap;
  uint uVar1;
  Sfm_Par_t *pSVar2;
  void **ppvVar3;
  Mio_Gate_t *pGate;
  char *pFans1;
  char *pFans2;
  double dVar4;
  double dVar5;
  word wVar6;
  word wVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  char *pFansT;
  int (*pSupp_00) [16];
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  word *pwVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  word wVar25;
  int iVar26;
  word (*pTruth) [4];
  ulong uVar27;
  Mio_Gate_t *pGate_00;
  undefined4 uVar28;
  undefined4 uVar29;
  char *local_12b8;
  Mio_Gate_t *local_12b0;
  Mio_Gate_t *local_12a8;
  int local_1298;
  uint local_1294;
  timespec ts;
  Vec_Int_t vFanins;
  int nSupp [4];
  word Masks [2] [8];
  int pSupp [4] [16];
  word uTruth [4] [4];
  int pAssump [1000];
  
  pSVar2 = p->pPars;
  if (pSVar2->fPrintDecs == 0) {
    if (pSVar2->fArea != 0) goto LAB_0053019a;
    uVar11 = pSVar2->nDecMax;
    uVar18 = 1;
    if (1 < (int)uVar11) {
      uVar18 = uVar11;
    }
    iVar20 = pSVar2->fVeryVerbose;
    p->DelayMin = 0;
    if (iVar20 == 0) {
      bVar8 = false;
      goto LAB_0052f87e;
    }
  }
  else {
    if (pSVar2->fArea != 0) {
LAB_0053019a:
      __assert_fail("p->pPars->fArea == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                    ,0x4bf,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
    }
    uVar18 = 1;
    if (1 < pSVar2->nDecMax) {
      uVar18 = pSVar2->nDecMax;
    }
    p->DelayMin = 0;
  }
  printf("\nNode %4d : MFFC %2d\n",(ulong)(uint)p->iTarget,(ulong)(uint)p->nMffc);
  uVar11 = p->pPars->nDecMax;
  bVar8 = true;
LAB_0052f87e:
  if (4 < (int)uVar11) {
    __assert_fail("p->pPars->nDecMax <= SFM_DEC_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                  ,0x4c5,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
  }
  Sfm_ObjSetupSimInfo(pObj);
  (p->vObjDec).nSize = 0;
  vMap = &p->vObjMap;
  local_1294 = 0xffffffff;
  uVar27 = 0;
  pFansT = (char *)0x0;
  local_12b8 = (char *)0x0;
  local_12a8 = (Mio_Gate_t *)0x0;
  local_12b0 = (Mio_Gate_t *)0x0;
  iVar20 = 0;
  do {
    if (p->pMit == (Sfm_Mit_t *)0x0) {
      local_1298 = Sfm_TimReadObjDelay(p->pTim,pObj->Id);
    }
    else {
      local_1298 = Sfm_MitReadObjDelay(p->pMit,pObj->Id);
    }
    iVar9 = (p->vObjDec).nSize;
    if (iVar20 < iVar9) {
      (p->vObjDec).nSize = iVar20;
      iVar9 = iVar20;
    }
    uVar11 = p->nPats[0];
    uVar15 = (ulong)uVar11;
    if (0x200 < uVar15) {
LAB_0053015c:
      __assert_fail("nBits >= 0 && nBits <= nWords * 64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0xc6,"void Abc_TtMask(word *, int, int)");
    }
    pTruth = uTruth + uVar27;
    iVar20 = iVar9 + 1;
    pwVar21 = Masks[0];
    uVar22 = uVar15;
    uVar24 = 0;
    do {
      uVar23 = uVar24 + 0x40;
      wVar25 = 0xffffffffffffffff;
      if (uVar15 < uVar23) {
        if (uVar24 < uVar15) {
          if (0x40 < uVar22) goto LAB_0053013d;
          wVar25 = 0xffffffffffffffff >> (0x40U - (char)uVar11 & 0x3f);
        }
        else {
          wVar25 = 0;
        }
      }
      *pwVar21 = wVar25;
      uVar22 = uVar22 - 0x40;
      pwVar21 = pwVar21 + 1;
      uVar24 = uVar23;
    } while (uVar23 != 0x200);
    uVar11 = p->nPats[1];
    uVar15 = (ulong)uVar11;
    if (0x200 < uVar15) goto LAB_0053015c;
    pwVar21 = Masks[1];
    uVar22 = uVar15;
    uVar24 = 0;
    do {
      uVar23 = uVar24 + 0x40;
      wVar25 = 0xffffffffffffffff;
      if (uVar15 < uVar23) {
        if (uVar24 < uVar15) {
          if (0x40 < uVar22) {
LAB_0053013d:
            __assert_fail("nBits >= 0 && nBits <= 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0xc2,"word Abc_Tt6Mask(int)");
          }
          wVar25 = 0xffffffffffffffff >> (0x40U - (char)uVar11 & 0x3f);
        }
        else {
          wVar25 = 0;
        }
      }
      *pwVar21 = wVar25;
      uVar22 = uVar22 - 0x40;
      pwVar21 = pwVar21 + 1;
      uVar24 = uVar23;
    } while (uVar23 != 0x200);
    pSupp_00 = pSupp + uVar27;
    iVar9 = Sfm_DecPeformDec_rec(p,*pTruth,*pSupp_00,pAssump,0,Masks,1,0);
    nSupp[uVar27] = iVar9;
    if (iVar9 == -2) {
joined_r0x0052fbea:
      if (bVar8) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n",uVar27 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
      }
    }
    else {
      if (bVar8) {
        printf("Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ",uVar27 & 0xffffffff,
               (ulong)(uint)p->nPats[0],(ulong)(uint)p->nPats[1]);
        Dau_DsdPrintFromTruth(*pTruth,iVar9);
      }
      if ((iVar9 == 1 && p->pTim != (Sfm_Tim_t *)0x0) && ((*pTruth)[0] == 0x5555555555555555)) {
        iVar10 = (*pSupp_00)[0];
        if (((long)iVar10 < 0) || ((p->vObjMap).nSize <= iVar10)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar26 = p->DelayInv;
        iVar10 = (p->vObjMap).pArray[iVar10];
        if (p->pMit == (Sfm_Mit_t *)0x0) {
          iVar10 = Sfm_TimReadObjDelay(p->pTim,iVar10);
        }
        else {
          iVar10 = Sfm_MitReadObjDelay(p->pMit,iVar10);
        }
        if (local_1298 <= iVar10 + iVar26) goto joined_r0x0052fbea;
      }
      if ((iVar9 == 1) && (p->pMit != (Sfm_Mit_t *)0x0)) {
        if ((*pTruth)[0] != 0x5555555555555555) goto LAB_00530070;
        goto joined_r0x0052fbea;
      }
      if (iVar9 < 2) {
LAB_00530070:
        p->nSuppVars = iVar9;
        wVar25 = (*pTruth)[0];
        wVar6 = uTruth[uVar27][1];
        wVar7 = uTruth[uVar27][3];
        p->Copy[2] = uTruth[uVar27][2];
        p->Copy[3] = wVar7;
        p->Copy[0] = wVar25;
        p->Copy[1] = wVar6;
        iVar20 = Sfm_LibImplementSimple
                           (p->pLib,*pTruth,*pSupp_00,iVar9,&p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < iVar9) {
          __assert_fail("nSupp[i] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x4ef,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[iVar9] = p->nLuckySizes[iVar9] + 1;
        if (iVar20 < 3) {
          p->nLuckyGates[iVar20] = p->nLuckyGates[iVar20] + 1;
          return iVar20;
        }
        __assert_fail("RetValue <= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                      ,0x4f1,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
      }
      Sfm_DecPrepareVec(vMap,*pSupp_00,iVar9,&p->vGateCut);
      iVar10 = Sfm_DecMffcAreaReal(pObj,&p->vGateCut,&p->vGateMffc);
      p->nSuppVars = iVar9;
      wVar25 = uTruth[uVar27][1];
      wVar6 = uTruth[uVar27][2];
      wVar7 = uTruth[uVar27][3];
      p->Copy[0] = (*pTruth)[0];
      p->Copy[1] = wVar25;
      p->Copy[2] = wVar6;
      p->Copy[3] = wVar7;
      uVar11 = Sfm_LibFindDelayMatches
                         (p->pLib,*pTruth,*pSupp_00,iVar9,&p->vMatchGates,&p->vMatchFans);
      if (0 < (int)uVar11) {
        lVar19 = 0;
        iVar26 = 0;
        do {
          iVar12 = clock_gettime(3,(timespec *)&ts);
          if (iVar12 < 0) {
            lVar16 = 1;
          }
          else {
            lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar16 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          uVar1 = (p->vMatchGates).nSize;
          if (((int)uVar1 <= (int)lVar19) || ((ulong)uVar1 <= lVar19 + 1U)) {
LAB_0053011e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          ppvVar3 = (p->vMatchGates).pArray;
          pGate_00 = (Mio_Gate_t *)ppvVar3[lVar19];
          pGate = (Mio_Gate_t *)ppvVar3[lVar19 + 1];
          dVar4 = Mio_GateReadArea(pGate_00);
          if (pGate == (Mio_Gate_t *)0x0) {
            uVar28 = 0;
            uVar29 = 0;
          }
          else {
            dVar5 = Mio_GateReadArea(pGate);
            uVar28 = SUB84(dVar5,0);
            uVar29 = (undefined4)((ulong)dVar5 >> 0x20);
          }
          uVar1 = (p->vMatchFans).nSize;
          if (((int)uVar1 <= (int)lVar19) || ((ulong)uVar1 <= lVar19 + 1U)) goto LAB_0053011e;
          iVar12 = (int)((float)(dVar4 + (double)CONCAT44(uVar29,uVar28)) * 1000.0);
          ppvVar3 = (p->vMatchFans).pArray;
          pFans1 = (char *)ppvVar3[lVar19];
          pFans2 = (char *)ppvVar3[lVar19 + 1];
          uVar1 = (uint)uVar27;
          vFanins.nCap = iVar9;
          vFanins.nSize = iVar9;
          vFanins.pArray = *pSupp_00;
          if (p->pMit == (Sfm_Mit_t *)0x0) {
            iVar14 = Sfm_TimEvalRemapping(p->pTim,&vFanins,vMap,pGate_00,pFans1,pGate,pFans2);
            iVar13 = p->pPars->DelAreaRatio;
            if (((iVar13 == 0) || (iVar12 - iVar10 == 0 || iVar12 < iVar10)) ||
               (iVar13 <= iVar14 / (iVar12 - iVar10))) {
              iVar13 = iVar26;
              if (local_1298 <= iVar14) goto LAB_0052fed6;
              goto LAB_0052fef7;
            }
          }
          else {
            iVar13 = Sfm_MitEvalRemapping
                               (p->pMit,&p->vGateMffc,pObj,&vFanins,vMap,pGate_00,pFans1,pGate,
                                pFans2);
            iVar14 = p->pPars->DelAreaRatio;
            if (((iVar14 == 0) || (iVar12 - iVar10 == 0 || iVar12 < iVar10)) ||
               (iVar14 <= iVar13 / (iVar12 - iVar10))) {
              iVar14 = local_1298;
              if (iVar13 <= iVar26) {
LAB_0052fed6:
                pFans2 = pFansT;
                pGate_00 = local_12b0;
                iVar13 = iVar26;
                pFans1 = local_12b8;
                pGate = local_12a8;
                iVar14 = local_1298;
                uVar1 = local_1294;
              }
LAB_0052fef7:
              local_1294 = uVar1;
              local_1298 = iVar14;
              local_12a8 = pGate;
              local_12b8 = pFans1;
              pFansT = pFans2;
              iVar26 = clock_gettime(3,(timespec *)&ts);
              if (iVar26 < 0) {
                lVar17 = -1;
              }
              else {
                lVar17 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
              }
              p->timeEval = p->timeEval + lVar17 + lVar16;
              local_12b0 = pGate_00;
              iVar26 = iVar13;
            }
          }
          lVar19 = lVar19 + 2;
        } while ((ulong)uVar11 * 2 != lVar19);
      }
    }
    uVar27 = uVar27 + 1;
    if (uVar27 == uVar18) {
      Sfm_ObjSetdownSimInfo((Abc_Obj_t *)pObj->pNtk->pData);
      if (local_1294 == 0xffffffff) {
        if (bVar8) {
          puts("Best  : NO DEC.");
        }
        p->nNoDecs = p->nNoDecs + 1;
        iVar20 = -2;
      }
      else {
        lVar19 = (long)(int)local_1294;
        if (bVar8) {
          printf("Best %d: %d  ",(ulong)local_1294,(ulong)(uint)nSupp[lVar19]);
        }
        iVar20 = Sfm_LibImplementGatesDelay
                           (p->pLib,pSupp[lVar19],local_12b0,local_12a8,local_12b8,pFansT,
                            &p->vObjGates,&p->vObjFanins);
        if (p->pPars->nVarMax < nSupp[lVar19]) {
          __assert_fail("nSupp[iBest] <= p->pPars->nVarMax",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x539,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckySizes[nSupp[lVar19]] = p->nLuckySizes[nSupp[lVar19]] + 1;
        if (2 < iVar20) {
          __assert_fail("RetValue <= 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmDec.c"
                        ,0x53b,"int Sfm_DecPeformDec3(Sfm_Dec_t *, Abc_Obj_t *)");
        }
        p->nLuckyGates[iVar20] = p->nLuckyGates[iVar20] + 1;
        p->DelayMin = local_1298;
        iVar20 = 1;
      }
      return iVar20;
    }
  } while( true );
}

Assistant:

int Sfm_DecPeformDec3( Sfm_Dec_t * p, Abc_Obj_t * pObj )
{
    word uTruth[SFM_DEC_MAX][SFM_WORD_MAX], Masks[2][SFM_SIM_WORDS];
    int pSupp[SFM_DEC_MAX][2*SFM_SUPP_MAX];
    int nSupp[SFM_DEC_MAX], pAssump[SFM_WIN_MAX];
    int fVeryVerbose = p->pPars->fPrintDecs || p->pPars->fVeryVerbose;
    int nDecs = Abc_MaxInt(p->pPars->nDecMax, 1);
    int i, k, DelayOrig = 0, DelayMin, GainMax, AreaMffc, nMatches, iBest = -1, RetValue, Prev = 0; 
    Mio_Gate_t * pGate1Best = NULL, * pGate2Best = NULL; 
    char * pFans1Best = NULL, * pFans2Best = NULL;
    assert( p->pPars->fArea == 0 );
    p->DelayMin = 0;
    //Sfm_DecPrint( p, NULL );
    if ( fVeryVerbose )
        printf( "\nNode %4d : MFFC %2d\n", p->iTarget, p->nMffc );
    // set limit on search for decompositions in delay-model
    assert( p->pPars->nDecMax <= SFM_DEC_MAX );
    Sfm_ObjSetupSimInfo( pObj );
    Vec_IntClear( &p->vObjDec );
    for ( i = 0; i < nDecs; i++ )
    {
        GainMax = 0;
        DelayMin = DelayOrig = Sfm_ManReadObjDelay( p, Abc_ObjId(pObj) );
        // reduce the variable array
        if ( Vec_IntSize(&p->vObjDec) > Prev )
            Vec_IntShrink( &p->vObjDec, Prev );
        Prev = Vec_IntSize(&p->vObjDec) + 1;
        // perform decomposition 
        Abc_TtMask( Masks[0], SFM_SIM_WORDS, p->nPats[0] );
        Abc_TtMask( Masks[1], SFM_SIM_WORDS, p->nPats[1] );        
        nSupp[i] = Sfm_DecPeformDec_rec( p, uTruth[i], pSupp[i], pAssump, 0, Masks, 1, 0 );
        if ( nSupp[i] == -2 )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( fVeryVerbose )
            printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  Supp = %d  ", i, p->nPats[0], p->nPats[1], nSupp[i] );
        if ( fVeryVerbose )
            Dau_DsdPrintFromTruth( uTruth[i], nSupp[i] );
        if ( p->pTim && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) && DelayMin <= p->DelayInv + Sfm_ManReadObjDelay(p, Vec_IntEntry(&p->vObjMap, pSupp[i][0])) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( p->pMit && nSupp[i] == 1 && uTruth[i][0] == ABC_CONST(0x5555555555555555) )
        {
            if ( fVeryVerbose )
                printf( "Dec  %d: Pat0 = %2d  Pat1 = %2d  NO DEC.\n", i, p->nPats[0], p->nPats[1] );
            continue;
        }
        if ( nSupp[i] < 2 )
        {
            p->nSuppVars = nSupp[i];
            Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
            RetValue = Sfm_LibImplementSimple( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vObjGates, &p->vObjFanins );
            assert( nSupp[i] <= p->pPars->nVarMax );
            p->nLuckySizes[nSupp[i]]++;
            assert( RetValue <= 2 );
            p->nLuckyGates[RetValue]++;
            return RetValue;
        }

        // get MFFC
        Sfm_DecPrepareVec( &p->vObjMap, pSupp[i], nSupp[i], &p->vGateCut ); // returns cut in p->vGateCut
        AreaMffc = Sfm_DecMffcAreaReal(pObj, &p->vGateCut, &p->vGateMffc ); // returns MFFC in p->vGateMffc

        // try the delay
        p->nSuppVars = nSupp[i];
        Abc_TtCopy( p->Copy, uTruth[i], SFM_WORD_MAX, 0 ); 
        nMatches = Sfm_LibFindDelayMatches( p->pLib, uTruth[i], pSupp[i], nSupp[i], &p->vMatchGates, &p->vMatchFans );
        for ( k = 0; k < nMatches; k++ )
        {
            abctime clk = Abc_Clock();
            Mio_Gate_t * pGate1 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+0 );
            Mio_Gate_t * pGate2 = (Mio_Gate_t *)Vec_PtrEntry( &p->vMatchGates, 2*k+1 );
            int AreaNew = Scl_Flt2Int( Mio_GateReadArea(pGate1) + (pGate2 ? Mio_GateReadArea(pGate2) : 0.0) );
            char * pFans1 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+0 );
            char * pFans2 = (char *)Vec_PtrEntry( &p->vMatchFans, 2*k+1 );
            Vec_Int_t vFanins = { nSupp[i], nSupp[i], pSupp[i] };
            // skip identical gate
            //if ( pGate2 == NULL && pGate1 == (Mio_Gate_t *)pObj->pData )
            //    continue;
            if ( p->pMit )
            {
                int Gain = Sfm_MitEvalRemapping( p->pMit, &p->vGateMffc, pObj, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Gain / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( GainMax < Gain )
                {
                    GainMax    = Gain;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            else
            {
                int Delay = Sfm_TimEvalRemapping( p->pTim, &vFanins, &p->vObjMap, pGate1, pFans1, pGate2, pFans2 );
                if ( p->pPars->DelAreaRatio && AreaNew > AreaMffc && (Delay / (AreaNew - AreaMffc)) < p->pPars->DelAreaRatio )
                    continue;
                if ( DelayMin > Delay )
                {
                    DelayMin   = Delay;
                    pGate1Best = pGate1;
                    pGate2Best = pGate2;
                    pFans1Best = pFans1;
                    pFans2Best = pFans2;
                    iBest      = i;
                }
            }
            p->timeEval += Abc_Clock() - clk;
        }
    }
//printf( "Gain max = %d.\n", GainMax );
    Sfm_ObjSetdownSimInfo( pObj );
    if ( iBest == -1 )
    {
        if ( fVeryVerbose )
            printf( "Best  : NO DEC.\n" );
        p->nNoDecs++;
        return -2;
    }
    if ( fVeryVerbose )
        printf( "Best %d: %d  ", iBest, nSupp[iBest] );
//    if ( fVeryVerbose )
//        Dau_DsdPrintFromTruth( uTruth[iBest], nSupp[iBest] );
    RetValue = Sfm_LibImplementGatesDelay( p->pLib, pSupp[iBest], pGate1Best, pGate2Best, pFans1Best, pFans2Best, &p->vObjGates, &p->vObjFanins );
    assert( nSupp[iBest] <= p->pPars->nVarMax );
    p->nLuckySizes[nSupp[iBest]]++;
    assert( RetValue <= 2 );
    p->nLuckyGates[RetValue]++;
    p->DelayMin = DelayMin;
    return 1;
}